

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

bool __thiscall
duckdb_snappy::SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>::SlowAppendFromSelf
          (SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> *this,size_t offset,size_t len)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  bool bVar4;
  char c;
  char *op;
  
  op = this->op_ptr_;
  pcVar2 = op + (this->full_size_ - (long)this->op_base_);
  if (((char *)(offset - 1) < pcVar2) && (len <= this->expected_ - (long)pcVar2)) {
    uVar3 = (long)pcVar2 - offset;
    while( true ) {
      bVar4 = len == 0;
      len = len - 1;
      if (bVar4) break;
      c = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3 >> 0x10][uVar3 & 0xffff];
      bVar1 = Append(this,&c,1,&op);
      if (!bVar1) break;
      uVar3 = uVar3 + 1;
    }
    this->op_ptr_ = op;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

inline size_t Size() const { return full_size_ + (op_ptr_ - op_base_); }